

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESOINN.cpp
# Opt level: O3

void __thiscall soinn::ESOINN::markAdjacentVertices(ESOINN *this,Vertex *vertex,int cID)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Vertex v;
  Vertex local_38;
  
  puVar1 = (undefined8 *)*vertex;
  for (puVar2 = (undefined8 *)*puVar1; puVar2 != puVar1; puVar2 = (undefined8 *)*puVar2) {
    local_38 = (Vertex)puVar2[2];
    if ((*(int *)((long)local_38 + 0x38) == -1) &&
       (*(double *)((long)local_38 + 0x40) <= *(double *)((long)*vertex + 0x40) &&
        *(double *)((long)*vertex + 0x40) != *(double *)((long)local_38 + 0x40))) {
      *(int *)((long)local_38 + 0x38) = cID;
      markAdjacentVertices(this,&local_38,cID);
    }
  }
  return;
}

Assistant:

void ESOINN::markAdjacentVertices(Vertex &vertex, int cID)
{
    AdjacencyIterator current, end;
    boost::tie(current, end) = boost::adjacent_vertices(vertex, graph);
    for(; current != end; current++){
        if(graph[*current].classId == -1 && graph[*current].density < graph[vertex].density)
        {
            graph[*current].classId = cID;
            Vertex v = *current;
            markAdjacentVertices(v, cID);
        }
    }
}